

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

D_Pass * find_pass(Grammar *g,char *start,char *end)

{
  uint uVar1;
  int iVar2;
  ushort **ppuVar3;
  bool bVar4;
  uint local_2c;
  uint l;
  uint i;
  char *end_local;
  char *start_local;
  Grammar *g_local;
  
  end_local = start;
  while( true ) {
    bVar4 = false;
    if (*end_local != '\0') {
      ppuVar3 = __ctype_b_loc();
      bVar4 = ((*ppuVar3)[(int)(uint)(byte)*end_local] & 0x2000) != 0;
    }
    if (!bVar4) break;
    end_local = end_local + 1;
  }
  uVar1 = (int)end - (int)end_local;
  local_2c = 0;
  while( true ) {
    if ((g->passes).n <= local_2c) {
      return (D_Pass *)0x0;
    }
    if ((uVar1 == (g->passes).v[local_2c]->name_len) &&
       (iVar2 = strncmp((g->passes).v[local_2c]->name,end_local,(ulong)uVar1), iVar2 == 0)) break;
    local_2c = local_2c + 1;
  }
  return (g->passes).v[local_2c];
}

Assistant:

D_Pass *find_pass(Grammar *g, char *start, char *end) {
  uint i, l;
  while (*start && isspace_(*start)) start++;
  l = end - start;
  for (i = 0; i < g->passes.n; i++)
    if (l == g->passes.v[i]->name_len && !strncmp(g->passes.v[i]->name, start, l)) return g->passes.v[i];
  return NULL;
}